

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void remove_stone_from_lookup(event_path_data evp,int stone_num)

{
  int iVar1;
  long lVar2;
  
  iVar1 = evp->stone_lookup_table_size;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      if (evp->stone_lookup_table[lVar2].global_id == stone_num) {
        if (iVar1 + -1 <= (int)lVar2) {
          return;
        }
        do {
          evp->stone_lookup_table[lVar2] = evp->stone_lookup_table[lVar2 + 1];
          lVar2 = lVar2 + 1;
        } while (lVar2 < (long)evp->stone_lookup_table_size + -1);
        return;
      }
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  return;
}

Assistant:

extern void
remove_stone_from_lookup(event_path_data evp, int stone_num)
{
    int i, stone = -1;
    for (i=0; i < evp->stone_lookup_table_size; i++) {
	if (evp->stone_lookup_table[i].global_id == stone_num) {
	    stone = i;
	    break;
	}
    }
    if (stone == -1) return;
    for (i=stone; i < evp->stone_lookup_table_size-1; i++) {
	evp->stone_lookup_table[i] = evp->stone_lookup_table[i+1];
    }
}